

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_psac.cpp
# Opt level: O2

void __thiscall PSAC_RandAll_Test::PSAC_RandAll_Test(PSAC_RandAll_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_001b4c80;
  return;
}

Assistant:

TEST(PSAC, RandAll) {
    mxx::comm c;

    size_t size = 130370;

    std::string str;
    if (c.rank() == 0) {
        // generate some random input string
        str = rand_dna(size, 7);
    }
    // distribute string equally
    std::string local_str = mxx::stable_distribute(str, c);

    // create suffix array w/o LCP
    suffix_array<std::string::iterator, uint32_t, false> sa(local_str.begin(), local_str.end(), c);

    // construct suffix array
    sa.construct();
    ASSERT_TRUE(check_sa_dss(sa, str, c));
    ASSERT_TRUE(check_sa_eqdss(sa, str, c));

    // construct with custom `k` to force early bucket chaising
    sa.construct(true, 3);
    ASSERT_TRUE(check_sa_dss(sa, str, c));
    ASSERT_TRUE(check_sa_eqdss(sa, str, c));

    // construct without bucket chaising
    sa.construct(false, 2);
    ASSERT_TRUE(check_sa_dss(sa, str, c));

    // construct with std::array based construction
    sa.construct_arr<2>(true);
    ASSERT_TRUE(check_sa_dss(sa, str, c));

    // construct with prefix-tripling
    sa.construct_arr<3>(true);
    ASSERT_TRUE(check_sa_dss(sa, str, c));

    // construct with prefix-quadrupling
    sa.construct_arr<3>(false);
    ASSERT_TRUE(check_sa_dss(sa, str, c));

    //TODO this one fails
    //sa.construct_fast();
    //ASSERT_TRUE(check_sa_dss(sa, str, c));
}